

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

int check_cert_time(X509_STORE_CTX *ctx,X509 *x)

{
  int iVar1;
  int iVar2;
  ASN1_TIME *pAVar3;
  int64_t iStack_28;
  int i;
  int64_t ptime;
  X509 *x_local;
  X509_STORE_CTX *ctx_local;
  
  if ((ctx->param->flags & 0x200000) == 0) {
    if ((ctx->param->flags & 2) == 0) {
      iStack_28 = time((time_t *)0x0);
    }
    else {
      iStack_28 = ctx->param->check_time;
    }
    pAVar3 = X509_get_notBefore(x);
    iVar1 = X509_cmp_time_posix(pAVar3,iStack_28);
    if (iVar1 == 0) {
      ctx->error = 0xd;
      ctx->current_cert = x;
      iVar2 = call_verify_cb(0,ctx);
      if (iVar2 == 0) {
        return 0;
      }
    }
    if (0 < iVar1) {
      ctx->error = 9;
      ctx->current_cert = x;
      iVar1 = call_verify_cb(0,ctx);
      if (iVar1 == 0) {
        return 0;
      }
    }
    pAVar3 = X509_get_notAfter(x);
    iVar1 = X509_cmp_time_posix(pAVar3,iStack_28);
    if (iVar1 == 0) {
      ctx->error = 0xe;
      ctx->current_cert = x;
      iVar2 = call_verify_cb(0,ctx);
      if (iVar2 == 0) {
        return 0;
      }
    }
    if (iVar1 < 0) {
      ctx->error = 10;
      ctx->current_cert = x;
      iVar1 = call_verify_cb(0,ctx);
      if (iVar1 == 0) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

static int check_cert_time(X509_STORE_CTX *ctx, X509 *x) {
  if (ctx->param->flags & X509_V_FLAG_NO_CHECK_TIME) {
    return 1;
  }

  int64_t ptime;
  if (ctx->param->flags & X509_V_FLAG_USE_CHECK_TIME) {
    ptime = ctx->param->check_time;
  } else {
    ptime = time(NULL);
  }

  int i = X509_cmp_time_posix(X509_get_notBefore(x), ptime);
  if (i == 0) {
    ctx->error = X509_V_ERR_ERROR_IN_CERT_NOT_BEFORE_FIELD;
    ctx->current_cert = x;
    if (!call_verify_cb(0, ctx)) {
      return 0;
    }
  }

  if (i > 0) {
    ctx->error = X509_V_ERR_CERT_NOT_YET_VALID;
    ctx->current_cert = x;
    if (!call_verify_cb(0, ctx)) {
      return 0;
    }
  }

  i = X509_cmp_time_posix(X509_get_notAfter(x), ptime);
  if (i == 0) {
    ctx->error = X509_V_ERR_ERROR_IN_CERT_NOT_AFTER_FIELD;
    ctx->current_cert = x;
    if (!call_verify_cb(0, ctx)) {
      return 0;
    }
  }

  if (i < 0) {
    ctx->error = X509_V_ERR_CERT_HAS_EXPIRED;
    ctx->current_cert = x;
    if (!call_verify_cb(0, ctx)) {
      return 0;
    }
  }

  return 1;
}